

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O0

char * deblank(char *input)

{
  size_t sVar1;
  char *result;
  size_t full_length;
  size_t length;
  int stop;
  int start;
  char *input_local;
  
  if (input == (char *)0x0) {
    input_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(input);
    if (sVar1 == 0) {
      input_local = (char *)calloc(1,8);
    }
    else {
      for (length._4_4_ = 0; input[length._4_4_] == ' '; length._4_4_ = length._4_4_ + 1) {
      }
      length._0_4_ = (int)sVar1;
      do {
        length._0_4_ = (int)length + -1;
        if ((int)length < 1) break;
      } while (input[(int)length] == ' ');
      sVar1 = ((sVar1 - (long)length._4_4_) + 1) - (sVar1 - (long)(int)length);
      input_local = (char *)calloc(sVar1 + 1,1);
      strncpy(input_local,input + length._4_4_,sVar1);
    }
  }
  return input_local;
}

Assistant:

char* 
deblank(const char* input) 
{
	int start = 0;
	int stop = 0;
	size_t length = 0;
	size_t full_length = 0;
	char* result = (char*)NULL;
	
	if (!input) return NULL;
	
	full_length = strlen(input);
	if (0 == full_length) {
		return (char*)calloc(1, sizeof(char*));
	}
	
	for (start = 0; *(input + start) == ' '; start++)
		;
	
	for (stop = full_length - 1; stop > 0; stop--) {
		if (*(input + stop) != ' ') break;
	} 
	
	length = full_length - start + 1; 
	length -= full_length - stop;
	
	result = (char*)calloc(length + 1, sizeof(char));
	strncpy(result, input + start, length);
	
	/* Normal function termination */
	return result;
}